

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

bool __thiscall File::lock(File *this)

{
  __pid_t _Var1;
  int iVar2;
  undefined8 local_30;
  flock fl;
  File *this_local;
  
  this->_locked = false;
  if ((this->_fh != (FILE *)0x0) && (this->_h != -1)) {
    local_30 = 1;
    fl.l_type = 0;
    fl.l_whence = 0;
    fl._4_4_ = 0;
    fl.l_start = 0;
    fl.l_len = 0;
    fl._24_8_ = this;
    _Var1 = getpid();
    fl.l_len = CONCAT44(fl.l_len._4_4_,_Var1);
    iVar2 = fcntl(this->_h,7,&local_30);
    if (iVar2 == 0) {
      this->_locked = true;
    }
  }
  return (bool)(this->_locked & 1);
}

Assistant:

bool File::lock ()
{
  _locked = false;
  if (_fh && _h != -1)
  {
#if defined(DARWIN)
                    // l_start l_len l_pid l_type   l_whence
    struct flock fl = {0,      0,    0,    F_WRLCK, SEEK_SET};
#elif defined(FREEBSD)
                    // l_type   l_whence  l_start  l_len  l_pid  l_sysid
    struct flock fl = {F_WRLCK, SEEK_SET, 0,       0,     0,     0 };
#else
                    // l_type   l_whence  l_start  l_len  l_pid
    struct flock fl = {F_WRLCK, SEEK_SET, 0,       0,     0 };
#endif
    fl.l_pid = getpid ();
    if (fcntl (_h, F_SETLKW, &fl) == 0)
      _locked = true;
  }

  return _locked;
}